

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

int __thiscall jwt::algorithm::rsa::verify(rsa *this,string *data,string *signature)

{
  bool bVar1;
  int iVar2;
  uint siglen;
  int extraout_EAX;
  pointer __p;
  signature_verification_exception *psVar3;
  EVP_MD_CTX *pEVar4;
  EVP_MD *type;
  void *d;
  size_t cnt;
  uchar *sigbuf;
  EVP_PKEY *pkey;
  ulong e;
  char *__rhs;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int res;
  _func_void_evp_md_ctx_st_ptr *local_38;
  undefined1 local_30 [8];
  unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)> ctx;
  string *signature_local;
  string *data_local;
  rsa *this_local;
  
  ctx._M_t.super___uniq_ptr_impl<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>._M_t.
  super__Tuple_impl<0UL,_evp_md_ctx_st_*,_void_(*)(evp_md_ctx_st_*)>.
  super__Head_base<0UL,_evp_md_ctx_st_*,_false>._M_head_impl = (evp_md_ctx_st *)signature;
  __p = (pointer)EVP_MD_CTX_new();
  local_38 = EVP_MD_CTX_free;
  std::unique_ptr<evp_md_ctx_st,void(*)(evp_md_ctx_st*)>::unique_ptr<void(*)(evp_md_ctx_st*),void>
            ((unique_ptr<evp_md_ctx_st,void(*)(evp_md_ctx_st*)> *)local_30,__p,&local_38);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_30);
  if (!bVar1) {
    psVar3 = (signature_verification_exception *)__cxa_allocate_exception(0x10);
    signature_verification_exception::signature_verification_exception
              (psVar3,"failed to verify signature: could not create context");
    __cxa_throw(psVar3,&signature_verification_exception::typeinfo,
                signature_verification_exception::~signature_verification_exception);
  }
  pEVar4 = (EVP_MD_CTX *)
           std::unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>::get
                     ((unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)> *)local_30);
  type = (EVP_MD *)(*this->md)();
  iVar2 = EVP_DigestInit(pEVar4,type);
  if (iVar2 == 0) {
    psVar3 = (signature_verification_exception *)__cxa_allocate_exception(0x10);
    signature_verification_exception::signature_verification_exception
              (psVar3,"failed to verify signature: VerifyInit failed");
    __cxa_throw(psVar3,&signature_verification_exception::typeinfo,
                signature_verification_exception::~signature_verification_exception);
  }
  pEVar4 = (EVP_MD_CTX *)
           std::unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>::get
                     ((unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)> *)local_30);
  d = (void *)std::__cxx11::string::data();
  cnt = std::__cxx11::string::size();
  iVar2 = EVP_DigestUpdate(pEVar4,d,cnt);
  if (iVar2 == 0) {
    psVar3 = (signature_verification_exception *)__cxa_allocate_exception(0x10);
    signature_verification_exception::signature_verification_exception
              (psVar3,"failed to verify signature: VerifyUpdate failed");
    __cxa_throw(psVar3,&signature_verification_exception::typeinfo,
                signature_verification_exception::~signature_verification_exception);
  }
  pEVar4 = (EVP_MD_CTX *)
           std::unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>::get
                     ((unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)> *)local_30);
  sigbuf = (uchar *)std::__cxx11::string::data();
  siglen = std::__cxx11::string::size();
  pkey = (EVP_PKEY *)
         std::__shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_48 = EVP_VerifyFinal(pEVar4,sigbuf,siglen,pkey);
  if (local_48 != 1) {
    psVar3 = (signature_verification_exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_c8,local_48);
    std::operator+(&local_a8,"evp verify final failed: ",&local_c8);
    std::operator+(&local_88,&local_a8," ");
    e = ERR_get_error();
    __rhs = ERR_error_string(e,(char *)0x0);
    std::operator+(&local_68,&local_88,__rhs);
    signature_verification_exception::signature_verification_exception(psVar3,&local_68);
    __cxa_throw(psVar3,&signature_verification_exception::typeinfo,
                signature_verification_exception::~signature_verification_exception);
  }
  std::unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)>::~unique_ptr
            ((unique_ptr<evp_md_ctx_st,_void_(*)(evp_md_ctx_st_*)> *)local_30);
  return extraout_EAX;
}

Assistant:

void verify(const std::string& data, const std::string& signature) const {
#ifdef OPENSSL10
				std::unique_ptr<EVP_MD_CTX, decltype(&EVP_MD_CTX_destroy)> ctx(EVP_MD_CTX_create(), EVP_MD_CTX_destroy);
#else
				std::unique_ptr<EVP_MD_CTX, decltype(&EVP_MD_CTX_free)> ctx(EVP_MD_CTX_create(), EVP_MD_CTX_free);
#endif
				if (!ctx)
					throw signature_verification_exception("failed to verify signature: could not create context");
				if (!EVP_VerifyInit(ctx.get(), md()))
					throw signature_verification_exception("failed to verify signature: VerifyInit failed");
				if (!EVP_VerifyUpdate(ctx.get(), data.data(), data.size()))
					throw signature_verification_exception("failed to verify signature: VerifyUpdate failed");
				auto res = EVP_VerifyFinal(ctx.get(), (const unsigned char*)signature.data(), static_cast<unsigned int>(signature.size()), pkey.get());
				if (res != 1)
					throw signature_verification_exception("evp verify final failed: " + std::to_string(res) + " " + ERR_error_string(ERR_get_error(), NULL));
			}